

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O2

void __thiscall duckdb::ColumnStatistics::Serialize(ColumnStatistics *this,Serializer *serializer)

{
  __uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
  local_18;
  
  Serializer::WriteProperty<duckdb::BaseStatistics>(serializer,100,"statistics",&this->stats);
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
       (tuple<duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>)
       (_Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
        )0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
            (serializer,0x65,"distinct",&this->distinct_stats,
             (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
              *)&local_18);
  ::std::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
               *)&local_18);
  return;
}

Assistant:

void ColumnStatistics::Serialize(Serializer &serializer) const {
	serializer.WriteProperty(100, "statistics", stats);
	serializer.WritePropertyWithDefault(101, "distinct", distinct_stats, unique_ptr<DistinctStatistics>());
}